

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_fa.c
# Opt level: O2

int isobusfs_srv_rx_cg_fa(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  undefined1 *puVar4;
  wchar_t wVar5;
  uint uVar6;
  int iVar7;
  wchar_t wVar8;
  int32_t iVar9;
  isobusfs_srv_client_conflict *client;
  isobusfs_srv_handles *piVar10;
  size_t __nbytes;
  undefined8 *buf;
  dirent *pdVar11;
  size_t __n;
  tm *ptVar12;
  ulong uVar13;
  DIR *pDVar14;
  isobusfs_srv_client *piVar15;
  undefined8 uVar16;
  __off_t _Var17;
  int *piVar18;
  size_t buf_size;
  undefined8 extraout_RDX;
  long lVar19;
  char cVar20;
  undefined1 uVar21;
  int iVar22;
  ushort uVar23;
  char *pcVar24;
  undefined1 uVar25;
  long lVar26;
  ssize_t sVar27;
  DIR *dir;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined1 *local_10d0;
  stat local_10c8;
  char linux_path [4096];
  
  switch(msg->buf[0] & 0xf) {
  case 0:
    uVar3 = *(ushort *)(msg->buf + 4);
    client = (isobusfs_srv_client_conflict *)isobusfs_srv_get_client_by_msg(priv,msg);
    if (client == (isobusfs_srv_client_conflict *)0x0) {
      uVar25 = 0;
      isobusfs_log(2,"client not found");
      uVar21 = 0x2c;
    }
    else {
      uVar25 = 0;
      uVar21 = 2;
      if ((uVar3 < 0xfffb) && ((ulong)uVar3 <= msg->len - 6U)) {
        pcVar24 = (char *)malloc(0x1000);
        if (pcVar24 == (char *)0x0) {
          isobusfs_log(2,"failed to allocate memory");
          return -0xc;
        }
        if (client->current_dir[0] == '\0') {
          isobusfs_srv_set_default_current_dir((isobusfs_srv_priv_conflict *)priv,client);
        }
        wVar5 = isobusfs_convert_relative_to_absolute
                          ((isobusfs_srv_priv_conflict *)priv,client->current_dir,
                           (char *)(msg->buf + 6),(ulong)*(ushort *)(msg->buf + 4),pcVar24,0x1000);
        if (wVar5 < L'\0') {
          uVar21 = 4;
LAB_00104ff8:
          uVar25 = 0;
        }
        else {
          isobusfs_log(4,"< rx: Open File Request. from client 0x%2x: %.*s. Current directory: %s",
                       client->addr,*(undefined2 *)(msg->buf + 4),msg->buf + 6,client->current_dir);
          bVar1 = msg->buf[2];
          if ((~bVar1 & 3) == 0) {
            wVar5 = isobusfs_path_to_linux_path
                              ((isobusfs_srv_priv_conflict *)priv,pcVar24,0x1000,linux_path,0x1000);
            if (L'\xffffffff' < wVar5) {
              piVar10 = isobusfs_srv_walk_handles(priv,linux_path);
              if (piVar10 != (isobusfs_srv_handles *)0x0) {
                isobusfs_log(1,"%s: Path %s is already opened\n","isobusfs_srv_fa_open_directory",
                             linux_path);
LAB_00104a12:
                wVar5 = L',';
LAB_00104a14:
                wVar8 = L'\0';
                goto switchD_00105053_caseD_3;
              }
              pDVar14 = opendir(linux_path);
              if (pDVar14 != (DIR *)0x0) {
                iVar7 = dirfd(pDVar14);
                if (iVar7 < 0) {
                  piVar18 = __errno_location();
                  iVar7 = *piVar18;
                  pcVar24 = strerror(iVar7);
                  isobusfs_log(1,
                               "%s: Error getting file descriptor for directory %s. Error %d (%s)\n"
                               ,"isobusfs_srv_fa_open_directory",linux_path,iVar7,pcVar24);
                  closedir(pDVar14);
                  goto LAB_00104a12;
                }
                iVar22 = fstat(iVar7,&local_10c8);
                if ((-1 < iVar22) && ((local_10c8.st_mode & 0xf000) == 0x4000)) {
                  wVar8 = isobusfs_srv_request_file
                                    (priv,(isobusfs_srv_client *)client,linux_path,iVar7,
                                     (DIR *)pDVar14);
                  if (wVar8 < L'\0') {
                    closedir(pDVar14);
                    wVar5 = wVar8;
                    goto LAB_00105498;
                  }
                  wVar5 = L'\0';
                  goto switchD_00105053_caseD_3;
                }
                isobusfs_log(1,"%s: Path %s is not a directory\n","isobusfs_srv_fa_open_directory",
                             linux_path);
                closedir(pDVar14);
                wVar5 = L'\x02';
                goto LAB_00104a14;
              }
              piVar18 = __errno_location();
              iVar7 = *piVar18;
              pcVar24 = strerror(iVar7);
              wVar8 = L'\0';
              wVar5 = L'\x01';
              isobusfs_log(1,"%s: Error opening directory %s. Error %d (%s)\n",
                           "isobusfs_srv_fa_open_directory",linux_path,iVar7,pcVar24);
              iVar7 = *piVar18;
              if (iVar7 == 0xd) goto switchD_00105053_caseD_3;
              if (iVar7 != 0xc) {
                if (iVar7 == 2) goto LAB_0010548d;
                goto LAB_00105485;
              }
LAB_00105489:
              wVar5 = L'+';
            }
            goto LAB_00105498;
          }
          wVar5 = isobusfs_path_to_linux_path
                            ((isobusfs_srv_priv_conflict *)priv,pcVar24,0x1000,linux_path,0x1000);
          uVar6 = 0;
          wVar8 = L'\0';
          if (L'\xffffffff' < wVar5) {
            isobusfs_log(4,"convert ISOBUS FS path to linux path: %.*s -> %s",0x1000,pcVar24);
            wVar5 = L'\x02';
            uVar21 = 2;
            switch(bVar1 & 3) {
            case 1:
              uVar6 = 1;
              break;
            case 2:
              uVar6 = (uint)((bVar1 & 8) == 0) << 9 | 2;
              break;
            case 3:
              goto switchD_00105053_caseD_3;
            }
            piVar10 = isobusfs_srv_walk_handles(priv,linux_path);
            if (piVar10 != (isobusfs_srv_handles *)0x0) {
              isobusfs_log(2,"Handle: %s is already opened by client: %x\n",linux_path,client->addr)
              ;
              iVar7 = piVar10->fd;
LAB_001052de:
              iVar22 = isobusfs_srv_request_file
                                 (priv,(isobusfs_srv_client *)client,linux_path,iVar7,(DIR *)0x0);
              uVar25 = (undefined1)iVar22;
              uVar21 = uVar25;
              if (-1 < iVar22) {
                uVar21 = 0;
                goto LAB_0010549f;
              }
LAB_00105357:
              close(iVar7);
              goto LAB_00104ff8;
            }
            iVar7 = open(linux_path,uVar6 | (bVar1 & 8) << 7);
            if (iVar7 < 0) {
              piVar18 = __errno_location();
              iVar7 = *piVar18;
              if (1 < iVar7 - 0x17U) {
                if (iVar7 != 2) {
                  if (iVar7 == 0xc) goto LAB_00105489;
                  if (iVar7 == 0xd) {
                    uVar21 = 1;
                  }
                  else if (iVar7 != 0x16) {
                    uVar21 = 0x2c;
                  }
                  goto LAB_00104ff8;
                }
LAB_0010548d:
                wVar8 = L'\0';
                wVar5 = L'\x04';
                goto switchD_00105053_caseD_3;
              }
              wVar5 = L'\x03';
            }
            else {
              iVar22 = fstat(iVar7,&local_10c8);
              if (-1 < iVar22) {
                if ((local_10c8.st_mode & 0xf000) == 0x8000) goto LAB_001052de;
                goto LAB_00105357;
              }
              close(iVar7);
LAB_00105485:
              wVar5 = L',';
            }
LAB_00105498:
            wVar8 = L'\0';
          }
switchD_00105053_caseD_3:
          uVar25 = (undefined1)wVar8;
          uVar21 = (undefined1)wVar5;
        }
      }
    }
LAB_0010549f:
    local_10e0._0_4_ = CONCAT13(uVar25,CONCAT12(uVar21,CONCAT11(msg->buf[1],0x20)));
    local_10e0 = CONCAT17(0xff,CONCAT25(0xffff,(undefined5)local_10e0));
    iVar7 = isobusfs_srv_sendto(priv,msg,&local_10e0,8);
    if (-1 < iVar7) {
      uVar16 = isobusfs_error_to_str(uVar21);
      isobusfs_log(4,"> tx: Open File Response. Error code: %d (%s).",uVar21,uVar16);
      return iVar7;
    }
    break;
  case 1:
    linux_path[0] = '!';
    linux_path[1] = '\0';
    linux_path[2] = '\0';
    linux_path[3] = '\0';
    linux_path[4] = '\0';
    linux_path[5] = '\0';
    linux_path[6] = '\0';
    linux_path[7] = '\0';
    isobusfs_log(4,"< rx: Seek File Request. Handle: %x, offset: %d, position mode: %d",msg->buf[2],
                 *(undefined4 *)(msg->buf + 4),msg->buf[3]);
    piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar15 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      cVar20 = ',';
    }
    else {
      uVar13 = (ulong)msg->buf[2];
      if (uVar13 == 0xff) {
        isobusfs_log(2,"failed to find handle: %x",0xff);
        cVar20 = '\x05';
      }
      else {
        iVar7 = *(int *)(msg->buf + 4);
        if (priv->handles[uVar13].dir == (DIR *)0x0) {
          uVar2 = msg->buf[3];
          if (uVar2 == '\x02') {
            if (0 < iVar7) {
              pcVar24 = "Invalid offset. Offset must be negative";
              goto LAB_0010508f;
            }
            iVar22 = 2;
LAB_00105203:
            _Var17 = lseek(priv->handles[uVar13].fd,(long)iVar7,iVar22);
            if (_Var17 < 0) {
              pcVar24 = "Failed to seek file";
LAB_00105222:
              isobusfs_log(2,pcVar24);
              cVar20 = ',';
            }
            else {
              priv->handles[uVar13].offset = _Var17;
              cVar20 = '\0';
            }
          }
          else {
            if (uVar2 == '\x01') {
              iVar22 = 1;
              if ((-1 < iVar7) || ((long)(ulong)(uint)-iVar7 <= priv->handles[uVar13].offset))
              goto LAB_00105203;
              pcVar24 = "Invalid offset. Negative offset is too big.";
            }
            else {
              if (uVar2 != '\0') {
                pcVar24 = "invalid position mode";
                goto LAB_00105222;
              }
              iVar22 = 0;
              if (-1 < iVar7) goto LAB_00105203;
              pcVar24 = "Invalid offset. Offset must be positive.";
            }
LAB_0010508f:
            isobusfs_log(2,pcVar24);
            cVar20 = '*';
          }
          iVar9 = (int32_t)priv->handles[uVar13].offset;
        }
        else {
          pDVar14 = fdopendir(priv->handles[uVar13].fd);
          if (pDVar14 == (DIR *)0x0) {
            cVar20 = ',';
          }
          else {
            rewinddir(pDVar14);
            iVar22 = 0;
            if (0 < iVar7) {
              iVar22 = iVar7;
            }
            iVar22 = iVar22 + 1;
            do {
              iVar22 = iVar22 + -1;
              if (iVar22 == 0) {
                priv->handles[uVar13].dir_pos = iVar7;
                cVar20 = '\0';
                goto LAB_00104fec;
              }
              pdVar11 = readdir(pDVar14);
            } while (pdVar11 != (dirent *)0x0);
            cVar20 = '-';
          }
LAB_00104fec:
          iVar9 = priv->handles[uVar13].dir_pos;
        }
        linux_path._4_3_ = (undefined3)iVar9;
        linux_path[7] = (char)((uint)iVar9 >> 0x18);
      }
    }
    linux_path[1] = msg->buf[1];
    linux_path[2] = cVar20;
    iVar7 = isobusfs_srv_sendto(priv,msg,linux_path,8);
    if (-1 < iVar7) {
      isobusfs_log(4,"> tx: Seek File Response. Error code: %d, offset: %d",cVar20,0);
      return 0;
    }
    pcVar24 = "can\'t send seek file response";
    goto LAB_00105500;
  case 2:
    local_10e0 = 0xffffffffffffff;
    uVar3 = *(ushort *)(msg->buf + 4);
    isobusfs_log(4,"< rx: Read File Request. tan: %d, handle: %d, count: %d",msg->buf[1],msg->buf[2]
                 ,uVar3);
    __nbytes = 0xfffa;
    if (uVar3 < 0xfffa) {
      __nbytes = (ulong)uVar3;
    }
    buf = (undefined8 *)malloc(__nbytes + 6);
    if (buf == (undefined8 *)0x0) {
      sVar27 = 0;
      isobusfs_log(2,"failed to allocate memory");
      buf = &local_10e0;
      uVar21 = 0x2b;
    }
    else {
      piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
      if (piVar15 == (isobusfs_srv_client *)0x0) {
        sVar27 = 0;
        isobusfs_log(2,"client not found");
        uVar21 = 0x2c;
      }
      else {
        local_10d8 = 0;
        piVar10 = priv->handles + msg->buf[2];
        if ((ulong)msg->buf[2] == 0xff) {
          isobusfs_log(2,"failed to find file with handle: %x",0xff);
          local_10d8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),4);
          piVar10 = (isobusfs_srv_handles *)0x0;
        }
        pDVar14 = (DIR *)piVar10->dir;
        if (pDVar14 == (DIR *)0x0) {
          sVar27 = read(piVar10->fd,(undefined1 *)((long)buf + 6),__nbytes);
        }
        else {
          iVar7 = -1;
          local_10d0 = (undefined1 *)((long)buf + 6);
          do {
            iVar7 = iVar7 + 1;
            if (piVar10->dir_pos <= iVar7) break;
            pdVar11 = readdir(pDVar14);
          } while (pdVar11 != (dirent *)0x0);
          sVar27 = 0;
          while (pdVar11 = readdir(pDVar14), pdVar11 != (dirent *)0x0) {
            pcVar24 = pdVar11->d_name;
            iVar7 = check_access_with_base(piVar10->path,pcVar24,4);
            if (((iVar7 == 0) &&
                (iVar7 = fstatat(piVar10->fd,pcVar24,(stat *)linux_path,0), -1 < iVar7)) &&
               (__n = strlen(pcVar24), puVar4 = local_10d0, __n < 0x100)) {
              if (__nbytes < __n + sVar27 + 10) break;
              local_10d0[sVar27] = (char)__n;
              memcpy(local_10d0 + sVar27 + 1,pcVar24,__n);
              lVar26 = sVar27 + __n;
              uVar6 = linux_path._24_4_ & 0xf000;
              iVar7 = check_access_with_base(piVar10->path,pcVar24,2);
              puVar4[lVar26 + 1] = iVar7 != 0 | (uVar6 == 0x4000) << 4;
              local_10c8.st_dev._0_1_ = linux_path[0x58];
              local_10c8.st_dev._1_1_ = linux_path[0x59];
              local_10c8.st_dev._2_1_ = linux_path[0x5a];
              local_10c8.st_dev._3_1_ = linux_path[0x5b];
              local_10c8.st_dev._4_1_ = linux_path[0x5c];
              local_10c8.st_dev._5_1_ = linux_path[0x5d];
              local_10c8.st_dev._6_1_ = linux_path[0x5e];
              local_10c8.st_dev._7_1_ = linux_path[0x5f];
              ptVar12 = localtime((time_t *)&local_10c8);
              if ((ptVar12 == (tm *)0x0) || (ptVar12->tm_year - 0xd0U < 0xffffff80)) {
                uVar23 = 0;
              }
              else {
                uVar23 = (short)ptVar12->tm_year * 0x200 + 0x6000U | (ushort)ptVar12->tm_mday |
                         (short)ptVar12->tm_mon * 0x20 + 0x20U;
              }
              *(ushort *)(puVar4 + lVar26 + 2) = uVar23;
              local_10c8.st_dev._0_1_ = linux_path[0x58];
              local_10c8.st_dev._1_1_ = linux_path[0x59];
              local_10c8.st_dev._2_1_ = linux_path[0x5a];
              local_10c8.st_dev._3_1_ = linux_path[0x5b];
              local_10c8.st_dev._4_1_ = linux_path[0x5c];
              local_10c8.st_dev._5_1_ = linux_path[0x5d];
              local_10c8.st_dev._6_1_ = linux_path[0x5e];
              local_10c8.st_dev._7_1_ = linux_path[0x5f];
              ptVar12 = localtime((time_t *)&local_10c8);
              if (ptVar12 == (tm *)0x0) {
                uVar23 = 0;
              }
              else {
                uVar23 = (ushort)(ptVar12->tm_min << 5) | (ushort)(ptVar12->tm_hour << 0xb) |
                         (ushort)(ptVar12->tm_sec / 2);
              }
              *(ushort *)(puVar4 + lVar26 + 4) = uVar23;
              *(undefined4 *)(puVar4 + lVar26 + 6) = linux_path._48_4_;
              sVar27 = lVar26 + 10;
            }
          }
        }
        uVar21 = 0x2d;
        if (sVar27 != 0) {
          uVar21 = (undefined1)local_10d8;
        }
        if (uVar3 == 0) {
          uVar21 = (undefined1)local_10d8;
        }
      }
    }
    *(undefined1 *)buf = 0x22;
    *(uint8_t *)((long)buf + 1) = msg->buf[1];
    *(undefined1 *)((long)buf + 2) = uVar21;
    *(short *)((long)buf + 4) = (short)sVar27;
    buf_size = 8;
    if (8 < (long)(sVar27 + 6U)) {
      buf_size = sVar27 + 6U;
    }
    iVar7 = isobusfs_srv_sendto(priv,msg,buf,buf_size);
    if (iVar7 < 0) {
      isobusfs_log(2,"can\'t send Read File Response");
    }
    else {
      uVar16 = isobusfs_error_to_str(uVar21);
      isobusfs_log(4,"> tx: Read File Response. Error code: %d (%s), readed size: %d",uVar21,uVar16,
                   sVar27);
    }
    free(buf);
    return iVar7;
  default:
    isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_fa");
    isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
    return 0;
  case 4:
    piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar15 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      cVar20 = ',';
    }
    else {
      bVar1 = msg->buf[2];
      uVar13 = (ulong)bVar1;
      if (uVar13 == 0xff) {
        isobusfs_log(2,"%s: invalid handle %d","isobusfs_srv_release_handle",0xff);
LAB_00104f15:
        isobusfs_log(2,"failed to release handle: %x",msg->buf[2]);
        cVar20 = '\x04';
      }
      else {
        lVar26 = 0;
        do {
          lVar19 = lVar26;
          if (lVar19 == 0xed) {
            isobusfs_log(1,"%s: client %p not found in handle %d","isobusfs_srv_release_handle",
                         piVar15,uVar13);
            goto LAB_00104f15;
          }
          lVar26 = lVar19 + 1;
        } while (priv->handles[uVar13].clients[lVar19] != piVar15);
        priv->handles[uVar13].clients[lVar19] = (isobusfs_srv_client *)0x0;
        piVar18 = &priv->handles[uVar13].refcount;
        *piVar18 = *piVar18 + -1;
        cVar20 = '\0';
        isobusfs_log(4,"%s: client %p removed from handle %d","isobusfs_srv_release_handle",piVar15,
                     uVar13);
        if (priv->handles[uVar13].refcount == 0) {
          isobusfs_log(4,"%s: closing handle %d","isobusfs_srv_release_handle",bVar1);
          pDVar14 = (DIR *)priv->handles[uVar13].dir;
          if (pDVar14 == (DIR *)0x0) {
            close(priv->handles[uVar13].fd);
          }
          else {
            closedir(pDVar14);
          }
          cVar20 = '\0';
          memset(priv->handles + uVar13,0,0x790);
          priv->handles_count = priv->handles_count + -1;
        }
      }
    }
    linux_path[0] = '$';
    linux_path[1] = msg->buf[1];
    linux_path[3] = -1;
    linux_path[4] = -1;
    linux_path[5] = -1;
    linux_path[6] = -1;
    linux_path[7] = -1;
    linux_path[8] = -1;
    linux_path[2] = cVar20;
    iVar7 = isobusfs_srv_sendto(priv,msg,linux_path,9);
    if (-1 < iVar7) {
      isobusfs_log(4,"> tx: Close File Response. Error code: %d",cVar20);
      return iVar7;
    }
  }
  pcVar24 = "can\'t send current directory response";
LAB_00105500:
  isobusfs_log(2,pcVar24);
  return iVar7;
}

Assistant:

int isobusfs_srv_rx_cg_fa(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	int func = isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	switch (func) {
	case ISOBUSFS_FA_F_OPEN_FILE_REQ:
		ret = isobusfs_srv_fa_open_file_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_CLOSE_FILE_REQ:
		ret = isobusfs_srv_fa_cf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_READ_FILE_REQ:
		ret = isobusfs_srv_fa_rf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_SEEK_FILE_REQ:
		ret = isobusfs_srv_fa_sf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_WRITE_FILE_REQ: /* fall through */
	default:
		pr_warn("%s: unsupported function: %i", __func__, func);
		isobusfs_srv_send_error(priv, msg,
					ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
	}

	return ret;
}